

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O3

Result * __thiscall
GeneticAlgorithm::operator()
          (Result *__return_storage_ptr__,GeneticAlgorithm *this,shared_ptr<Instance> *instance)

{
  vector<int,_std::allocator<int>_> *__x;
  element_type *peVar1;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> __first;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> __last;
  pointer pIVar2;
  GeneticAlgorithm *pGVar3;
  Result *this_00;
  GeneticAlgorithm *pGVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  string *psVar10;
  Individual *pIVar11;
  Individual *pIVar12;
  Individual *pIVar13;
  uint uVar14;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> unaff_R12;
  __normal_iterator<Individual_*,_std::vector<Individual,_std::allocator<Individual>_>_> __i;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Individual father;
  Individual child;
  Individual local_e0;
  shared_ptr<Instance> local_b8;
  shared_ptr<Instance> local_a8;
  Result *local_98;
  anon_class_8_1_0902ba13 local_90;
  GeneticAlgorithm *local_88;
  Individual local_80;
  Individual local_58;
  
  lVar5 = std::chrono::_V2::system_clock::now();
  local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (instance->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  initializePopulation(this,&local_a8);
  local_98 = __return_storage_ptr__;
  if (local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  lVar6 = std::chrono::_V2::system_clock::now();
  pGVar4 = this;
  this_00 = local_98;
  pGVar3 = local_88;
  while( true ) {
    local_88 = pGVar4;
    local_98 = this_00;
    if (lVar5 + 5000000000 <= lVar6) {
      local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)instance;
      local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)instance + 8);
      if (local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_88 = pGVar3;
      pIVar12 = returnBestIndividual(this,&local_b8);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_80.coresAsignedToTasks,&pIVar12->coresAsignedToTasks);
      local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pIVar12->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (pIVar12->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Result::Result(this_00,&local_80);
      if (local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_80.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_80.coresAsignedToTasks.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.coresAsignedToTasks.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      return this_00;
    }
    peVar1 = (this->population).
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    __first._M_current =
         (peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_90.instance = instance;
    if (__first._M_current != __last._M_current) {
      uVar7 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0x3333333333333333;
      lVar6 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::operator()(__first,__last,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Domomod[P]PCmax_SourceCode_Algorithms_GeneticAlgorithm_cpp:20:53)>
                       )instance);
      if ((long)__last._M_current - (long)__first._M_current < 0x281) {
        std::operator()(__first,__last,
                        (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Domomod[P]PCmax_SourceCode_Algorithms_GeneticAlgorithm_cpp:20:53)>
                         )instance);
      }
      else {
        unaff_R12._M_current = __first._M_current + 0x10;
        std::operator()(__first,unaff_R12,
                        (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Domomod[P]PCmax_SourceCode_Algorithms_GeneticAlgorithm_cpp:20:53)>
                         )instance);
        for (; unaff_R12._M_current != __last._M_current;
            unaff_R12._M_current = unaff_R12._M_current + 1) {
          std::operator()(unaff_R12,
                          (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Domomod[P]PCmax_SourceCode_Algorithms_GeneticAlgorithm_cpp:20:53)>
                           )instance);
        }
      }
    }
    p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var8->_M_use_count = 1;
    p_Var8->_M_weak_count = 1;
    p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ac18;
    p_Var8[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var8[1]._M_use_count = 0;
    p_Var8[1]._M_weak_count = 0;
    p_Var8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    peVar1 = (this->population).
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)(((long)(peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl
                       .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 0x14) break;
    p_Var9 = p_Var8 + 1;
    lVar6 = 0;
    pIVar12 = (Individual *)0x0;
    do {
      peVar1 = (this->population).
               super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      pIVar2 = (peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar11 = (Individual *)
                (((long)(peVar1->super__Vector_base<Individual,_std::allocator<Individual>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 3) *
                -0x3333333333333333);
      if (pIVar11 < pIVar12 || (long)pIVar11 - (long)pIVar12 == 0) goto LAB_001030d8;
      std::vector<Individual,_std::allocator<Individual>_>::push_back
                ((vector<Individual,_std::allocator<Individual>_> *)p_Var9,
                 (value_type *)((long)&pIVar2->coresAsignedToTasks + lVar6));
      pIVar12 = (Individual *)
                ((long)&(pIVar12->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1);
      lVar6 = lVar6 + 0x28;
    } while (pIVar12 != (Individual *)0x14);
    unaff_R12._M_current = (Individual *)p_Var8[1]._vptr__Sp_counted_base;
    pIVar12 = *(Individual **)&p_Var8[1]._M_use_count;
    uVar14 = (int)((long)pIVar12 - (long)unaff_R12._M_current >> 3) * -0x33333333;
    pGVar3 = local_88;
    if (0 < (int)uVar14) {
      pIVar11 = (Individual *)(ulong)(uVar14 & 0x7fffffff);
      unaff_R12._M_current = (Individual *)0x0;
      do {
        pIVar12 = (Individual *)
                  ((*(long *)&p_Var8[1]._M_use_count - (long)p_Var8[1]._vptr__Sp_counted_base >> 3)
                  * -0x3333333333333333);
        if (pIVar12 < unaff_R12._M_current || (long)pIVar12 - (long)unaff_R12._M_current == 0)
        goto LAB_001030e9;
        __x = (vector<int,_std::allocator<int>_> *)
              (p_Var8[1]._vptr__Sp_counted_base + (long)unaff_R12._M_current * 5);
        std::vector<int,_std::allocator<int>_>::vector(&local_e0.coresAsignedToTasks,__x);
        local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             __x[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
        local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                __x[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_finish;
        if (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        lVar6 = 0;
        pIVar12 = (Individual *)0x0;
        do {
          if (unaff_R12._M_current != pIVar12) {
            pIVar13 = (Individual *)
                      ((*(long *)&p_Var8[1]._M_use_count - (long)p_Var8[1]._vptr__Sp_counted_base >>
                       3) * -0x3333333333333333);
            if (pIVar13 < pIVar12 || (long)pIVar13 - (long)pIVar12 == 0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,pIVar12);
              goto LAB_001030d8;
            }
            Individual::makeOffspring
                      (&local_58,&local_e0,
                       (Individual *)((long)p_Var8[1]._vptr__Sp_counted_base + lVar6));
            std::vector<Individual,_std::allocator<Individual>_>::push_back
                      ((vector<Individual,_std::allocator<Individual>_> *)p_Var9,&local_58);
            if (local_58.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_58.usedInstance.
                         super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ;
            }
            if (local_58.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58.coresAsignedToTasks.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_58.coresAsignedToTasks.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_58.coresAsignedToTasks.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
          pIVar12 = (Individual *)
                    ((long)&(pIVar12->coresAsignedToTasks).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 1);
          lVar6 = lVar6 + 0x28;
        } while (pIVar11 != pIVar12);
        if (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_e0.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_e0.coresAsignedToTasks.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_e0.coresAsignedToTasks.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        unaff_R12._M_current =
             (Individual *)
             ((long)&((unaff_R12._M_current)->coresAsignedToTasks).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + 1);
      } while (unaff_R12._M_current != pIVar11);
      unaff_R12._M_current = (Individual *)p_Var8[1]._vptr__Sp_counted_base;
      pIVar12 = *(Individual **)&p_Var8[1]._M_use_count;
      pGVar3 = local_88;
    }
    for (; this = local_88, unaff_R12._M_current != pIVar12;
        unaff_R12._M_current = unaff_R12._M_current + 1) {
      local_88 = pGVar3;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_e0.coresAsignedToTasks,&(unaff_R12._M_current)->coresAsignedToTasks);
      local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((unaff_R12._M_current)->usedInstance).
           super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = ((unaff_R12._M_current)->usedInstance).
              super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      uVar14 = rand();
      if ((uVar14 & 1) == 0) {
        Individual::mutate(&local_e0);
      }
      if (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.usedInstance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e0.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.coresAsignedToTasks.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e0.coresAsignedToTasks.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.coresAsignedToTasks.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pGVar3 = local_88;
      local_88 = this;
    }
    (local_88->population).
    super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)p_Var9;
    p_Var9 = (local_88->population).
             super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (local_88->population).
    super___shared_ptr<std::vector<Individual,_std::allocator<Individual>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var8;
    local_88 = pGVar3;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
    lVar6 = std::chrono::_V2::system_clock::now();
    pGVar4 = local_88;
    instance = local_90.instance;
    this_00 = local_98;
    pGVar3 = local_88;
  }
LAB_001030fa:
  psVar10 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar10 = psVar10 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar10,
             "Wanted to rewrite more individuals to next population that there is individuals","");
  __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
LAB_001030d8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pIVar12);
LAB_001030e9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
             unaff_R12._M_current);
  goto LAB_001030fa;
}

Assistant:

Result GeneticAlgorithm::operator()(std::shared_ptr<Instance> instance) {
	auto start = high_resolution_clock::now();
	auto end = start + seconds(5);

	initializePopulation(instance);

	while(high_resolution_clock::now() < end){
		std::sort(population->begin(), population->end(), [&instance](Individual& a, Individual& b) { return a.valueFunction(instance) < b.valueFunction(instance); } );

		std::shared_ptr<std::vector<Individual>> newPopulation = std::make_shared<vector<Individual>>();
		int rewriteToNextPopulationCount = 20;
		
		if(rewriteToNextPopulationCount > population->size()) throw std::string("Wanted to rewrite more individuals to next population that there is individuals");

		for(int i = 0; i < rewriteToNextPopulationCount; i++){
			newPopulation->push_back(population->at(i));
		}

		int startingSize = newPopulation->size();
		for(int i = 0; i < startingSize; i++){
			Individual father = newPopulation->at(i);
			for(int j = 0; j < startingSize; j++){
				if(i != j){
					Individual& mother = newPopulation->at(j);
					Individual child = father.makeOffspring(mother);
					newPopulation->push_back(child);
				}
			}
		}

		for(Individual ind : *newPopulation){
			if(rand()%2 == 0)
				ind.mutate();
		}

		population.swap(newPopulation);
	}
	return (Result)returnBestIndividual(instance);
}